

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int little2_attributeValueTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  long lVar4;
  byte *pbVar5;
  char cVar6;
  long lVar7;
  bool bVar8;
  
  iVar3 = -4;
  if (ptr < end) {
    lVar4 = (long)end - (long)ptr;
    iVar3 = -1;
    pbVar2 = (byte *)ptr;
    if (1 < lVar4) {
      while (1 < lVar4) {
        bVar1 = pbVar2[1];
        if (bVar1 < 0xdc) {
          cVar6 = '\a';
          if (3 < bVar1 - 0xd8) {
            if (bVar1 == 0) {
              cVar6 = *(char *)((long)enc[1].scanners + (ulong)*pbVar2);
            }
            else {
LAB_006e729f:
              cVar6 = '\x1d';
            }
          }
        }
        else if (bVar1 - 0xdc < 4) {
          cVar6 = '\b';
        }
        else {
          if ((bVar1 != 0xff) || (*pbVar2 < 0xfe)) goto LAB_006e729f;
          cVar6 = '\0';
        }
        lVar7 = 2;
        switch(cVar6) {
        case '\x02':
          *nextTokPtr = (char *)pbVar2;
          return 0;
        case '\x03':
          if (pbVar2 == (byte *)ptr) {
            iVar3 = little2_scanRef(enc,(char *)(pbVar2 + 2),end,nextTokPtr);
            return iVar3;
          }
          goto LAB_006e72ee;
        case '\x04':
        case '\x05':
        case '\b':
          break;
        case '\x06':
          lVar7 = 3;
          break;
        case '\a':
          lVar7 = 4;
          break;
        case '\t':
          if (pbVar2 == (byte *)ptr) {
            pbVar5 = pbVar2 + 2;
            if ((long)end - (long)pbVar5 < 2) {
              return -3;
            }
            if (pbVar2[3] == 0) {
              bVar8 = *(char *)((long)enc[1].scanners + (ulong)*pbVar5) == '\n';
            }
            else {
              bVar8 = false;
            }
            if (bVar8) {
              pbVar5 = pbVar2 + 4;
            }
            *nextTokPtr = (char *)pbVar5;
            return 7;
          }
          goto LAB_006e72ee;
        case '\n':
          if (pbVar2 == (byte *)ptr) {
            *nextTokPtr = (char *)(pbVar2 + 2);
            return 7;
          }
          goto LAB_006e72ee;
        default:
          if (cVar6 == '\x15') {
            if (pbVar2 == (byte *)ptr) {
              *nextTokPtr = (char *)(pbVar2 + 2);
              return 0x27;
            }
            goto LAB_006e72ee;
          }
        }
        lVar4 = (long)end - (long)(pbVar2 + lVar7);
        pbVar2 = pbVar2 + lVar7;
      }
LAB_006e72ee:
      *nextTokPtr = (char *)pbVar2;
      iVar3 = 6;
    }
  }
  return iVar3;
}

Assistant:

static int PTRCALL
PREFIX(attributeValueTok)(const ENCODING *enc, const char *ptr, const char *end,
                          const char **nextTokPtr) {
  const char *start;
  if (ptr >= end)
    return XML_TOK_NONE;
  else if (! HAS_CHAR(enc, ptr, end)) {
    /* This line cannot be executed.  The incoming data has already
     * been tokenized once, so incomplete characters like this have
     * already been eliminated from the input.  Retaining the paranoia
     * check is still valuable, however.
     */
    return XML_TOK_PARTIAL; /* LCOV_EXCL_LINE */
  }
  start = ptr;
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
#  define LEAD_CASE(n)                                                         \
  case BT_LEAD##n:                                                             \
    ptr += n; /* NOTE: The encoding has already been validated. */             \
    break;
      LEAD_CASE(2)
      LEAD_CASE(3)
      LEAD_CASE(4)
#  undef LEAD_CASE
    case BT_AMP:
      if (ptr == start)
        return PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    case BT_LT:
      /* this is for inside entity references */
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    case BT_LF:
      if (ptr == start) {
        *nextTokPtr = ptr + MINBPC(enc);
        return XML_TOK_DATA_NEWLINE;
      }
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    case BT_CR:
      if (ptr == start) {
        ptr += MINBPC(enc);
        if (! HAS_CHAR(enc, ptr, end))
          return XML_TOK_TRAILING_CR;
        if (BYTE_TYPE(enc, ptr) == BT_LF)
          ptr += MINBPC(enc);
        *nextTokPtr = ptr;
        return XML_TOK_DATA_NEWLINE;
      }
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    case BT_S:
      if (ptr == start) {
        *nextTokPtr = ptr + MINBPC(enc);
        return XML_TOK_ATTRIBUTE_VALUE_S;
      }
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  *nextTokPtr = ptr;
  return XML_TOK_DATA_CHARS;
}